

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_app.h
# Opt level: O2

void sapp_set_clipboard_string(char *str)

{
  if (!_sapp.clipboard.enabled) {
    return;
  }
  if (str != (char *)0x0) {
    _sapp_strcpy(str,_sapp.clipboard.buffer,_sapp.clipboard.buf_size);
    return;
  }
  __assert_fail("str",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_app.h"
                ,0x2f21,"void sapp_set_clipboard_string(const char *)");
}

Assistant:

SOKOL_API_IMPL void sapp_set_clipboard_string(const char* str) {
    if (!_sapp.clipboard.enabled) {
        return;
    }
    SOKOL_ASSERT(str);
    #if defined(_SAPP_MACOS)
        _sapp_macos_set_clipboard_string(str);
    #elif defined(_SAPP_EMSCRIPTEN)
        _sapp_emsc_set_clipboard_string(str);
    #elif defined(_SAPP_WIN32)
        _sapp_win32_set_clipboard_string(str);
    #else
        /* not implemented */
    #endif
    _sapp_strcpy(str, _sapp.clipboard.buffer, _sapp.clipboard.buf_size);
}